

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_composites.cpp
# Opt level: O2

spv_result_t spvtools::val::CompositesPass(ValidationState_t *_,Instruction *inst)

{
  uint32_t *puVar1;
  uint16_t uVar2;
  pointer psVar3;
  pointer psVar4;
  bool bVar5;
  int32_t iVar6;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  spv_result_t sVar10;
  uint32_t uVar11;
  uint uVar12;
  Op OVar13;
  uint32_t id;
  uint32_t uVar14;
  Instruction *pIVar15;
  Instruction *pIVar16;
  Instruction *pIVar17;
  ulong uVar18;
  char *pcVar19;
  ulong uVar20;
  size_t operand_index;
  pointer operand_index_00;
  uint32_t result_num_cols;
  uint32_t local_250;
  uint32_t result_component_type;
  uint32_t result_col_type;
  uint32_t matrix_component_type;
  uint32_t matrix_num_cols;
  uint32_t matrix_num_rows;
  uint32_t member_type;
  uint uStack_234;
  ulong local_218;
  uint32_t matrix_col_type;
  DiagnosticStream local_208;
  
  uVar2 = (inst->inst_).opcode;
  switch(uVar2) {
  case 0x4d:
    uVar9 = (inst->inst_).type_id;
    OVar13 = ValidationState_t::GetIdOpcode(_,uVar9);
    iVar6 = spvOpcodeIsScalarType(OVar13);
    if (iVar6 == 0) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Expected Result Type to be a scalar type";
    }
    else {
      uVar11 = ValidationState_t::GetOperandTypeId(_,inst,2);
      OVar13 = ValidationState_t::GetIdOpcode(_,uVar11);
      if (OVar13 == OpTypeVector) {
        uVar11 = ValidationState_t::GetComponentType(_,uVar11);
        if (uVar11 == uVar9) {
          uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,3);
          pIVar15 = ValidationState_t::FindDef(_,uVar7);
          if (((pIVar15 == (Instruction *)0x0) || (uVar9 = (pIVar15->inst_).type_id, uVar9 == 0)) ||
             (bVar5 = ValidationState_t::IsIntScalarType(_,uVar9), !bVar5)) {
LAB_001ad2eb:
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar19 = "Expected Index to be int scalar";
          }
          else {
            bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
            if (!bVar5) {
              return SPV_SUCCESS;
            }
            bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
            if (!bVar5) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar19 = "Cannot extract from a vector of 8- or 16-bit types";
          }
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar19 = "Expected Vector component type to be equal to Result Type";
        }
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = "Expected Vector type to be OpTypeVector";
      }
    }
    break;
  case 0x4e:
    uVar9 = (inst->inst_).type_id;
    OVar13 = ValidationState_t::GetIdOpcode(_,uVar9);
    if (OVar13 == OpTypeVector) {
      uVar11 = ValidationState_t::GetOperandTypeId(_,inst,2);
      if (uVar11 == uVar9) {
        uVar11 = ValidationState_t::GetOperandTypeId(_,inst,3);
        uVar9 = ValidationState_t::GetComponentType(_,uVar9);
        if (uVar9 == uVar11) {
          uVar9 = ValidationState_t::GetOperandTypeId(_,inst,4);
          bVar5 = ValidationState_t::IsIntScalarType(_,uVar9);
          if (!bVar5) goto LAB_001ad2eb;
          bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
          if (!bVar5) {
            return SPV_SUCCESS;
          }
          bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
          if (!bVar5) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar19 = "Cannot insert into a vector of 8- or 16-bit types";
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::operator<<((ostream *)&local_208,
                          "Expected Component type to be equal to Result Type ");
          pcVar19 = "component type";
        }
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = "Expected Vector type to be equal to Result Type";
      }
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Expected Result Type to be OpTypeVector";
    }
    break;
  case 0x4f:
    pIVar15 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar15 == (Instruction *)0x0) || ((pIVar15->inst_).opcode != 0x17)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&local_208,"The Result Type of OpVectorShuffle must be");
      std::operator<<((ostream *)&local_208," OpTypeVector. Found Op");
      pcVar19 = spvOpcodeString((uint)(pIVar15->inst_).opcode);
      std::operator<<((ostream *)&local_208,pcVar19);
LAB_001ad0da:
      std::operator<<((ostream *)&local_208,".");
      goto LAB_001ad9ee;
    }
    psVar3 = (inst->operands_).
             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl
             .super__Vector_impl_data._M_finish;
    psVar4 = (inst->operands_).
             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar15,2);
    if (((long)psVar3 - (long)psVar4 >> 4) - 4U != (ulong)uVar7) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&local_208,
                      "OpVectorShuffle component literals count does not match Result Type <id> ");
      ValidationState_t::getIdName_abi_cxx11_((string *)&member_type,_,(pIVar15->inst_).result_id);
      std::operator<<((ostream *)&local_208,(string *)&member_type);
      std::operator<<((ostream *)&local_208,"s vector component count.");
      std::__cxx11::string::_M_dispose();
      goto LAB_001ad9ee;
    }
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar16 = ValidationState_t::FindDef(_,uVar7);
    pIVar16 = ValidationState_t::FindDef(_,(pIVar16->inst_).type_id);
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,3);
    pIVar17 = ValidationState_t::FindDef(_,uVar7);
    pIVar17 = ValidationState_t::FindDef(_,(pIVar17->inst_).type_id);
    if ((pIVar16 == (Instruction *)0x0) || ((pIVar16->inst_).opcode != 0x17)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = "The type of Vector 1 must be OpTypeVector.";
    }
    else if ((pIVar17 == (Instruction *)0x0) || ((pIVar17->inst_).opcode != 0x17)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = "The type of Vector 2 must be OpTypeVector.";
    }
    else {
      uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar15,1);
      uVar12 = Instruction::GetOperandAs<unsigned_int>(pIVar16,1);
      if (uVar12 == uVar7) {
        uVar12 = Instruction::GetOperandAs<unsigned_int>(pIVar17,1);
        if (uVar12 == uVar7) {
          uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar16,2);
          uVar12 = Instruction::GetOperandAs<unsigned_int>(pIVar17,2);
          uVar20 = 4;
          do {
            if ((ulong)((long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar20) {
              bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
              if (!bVar5) {
                return SPV_SUCCESS;
              }
              bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
              if (!bVar5) {
                return SPV_SUCCESS;
              }
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar19 = "Cannot shuffle a vector of 8- or 16-bit types";
              goto LAB_001ad9dc;
            }
            uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,uVar20);
            uVar20 = uVar20 + 1;
          } while ((uVar8 == 0xffffffff) || (uVar8 < uVar12 + uVar7));
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)&local_208,"Component index ");
          std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
          std::operator<<((ostream *)&local_208," is out of bounds for ");
          std::operator<<((ostream *)&local_208,"combined (Vector1 + Vector2) size of ");
          std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
          goto LAB_001ad0da;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar19 = "The Component Type of Vector 2 must be the same as ResultType.";
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar19 = "The Component Type of Vector 1 must be the same as ResultType.";
      }
    }
    break;
  case 0x50:
    uVar20 = (long)(inst->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(inst->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
    uVar9 = (inst->inst_).type_id;
    OVar13 = ValidationState_t::GetIdOpcode(_,uVar9);
    uVar7 = (uint)uVar20;
    switch(OVar13) {
    case OpTypeVector:
      uVar11 = ValidationState_t::GetDimension(_,uVar9);
      local_250 = ValidationState_t::GetComponentType(_,uVar9);
      if (uVar7 < 4) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = "Expected number of constituents to be at least 2";
      }
      else {
        local_218 = uVar20 & 0xffffffff;
        uVar9 = 0;
        for (operand_index = 2; local_218 != operand_index; operand_index = operand_index + 1) {
          id = ValidationState_t::GetOperandTypeId(_,inst,operand_index);
          uVar14 = 1;
          if (id != local_250) {
            OVar13 = ValidationState_t::GetIdOpcode(_,id);
            if ((OVar13 != OpTypeVector) ||
               (uVar14 = ValidationState_t::GetComponentType(_,id), uVar14 != local_250)) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::operator<<((ostream *)&local_208,
                              "Expected Constituents to be scalars or vectors of");
              pcVar19 = " the same type as Result Type components";
              goto LAB_001ad9dc;
            }
            uVar14 = ValidationState_t::GetDimension(_,id);
          }
          uVar9 = uVar9 + uVar14;
        }
        if (uVar11 == uVar9) goto LAB_001ad89d;
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&local_208,
                        "Expected total number of given components to be equal ");
        pcVar19 = "to the size of Result Type vector";
      }
      break;
    case OpTypeMatrix:
      _member_type = _member_type & 0xffffffff00000000;
      result_num_cols = 0;
      result_col_type = 0;
      result_component_type = 0;
      bVar5 = ValidationState_t::GetMatrixTypeInfo
                        (_,uVar9,&member_type,&result_num_cols,&result_col_type,
                         &result_component_type);
      if (!bVar5) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                      ,0x103,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                     );
      }
      if (result_num_cols + 2 == uVar7) {
        uVar18 = 2;
        do {
          if ((uVar20 & 0xffffffff) <= uVar18) goto LAB_001ad89d;
          uVar9 = ValidationState_t::GetOperandTypeId(_,inst,uVar18);
          uVar18 = uVar18 + 1;
        } while (uVar9 == result_col_type);
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&local_208,"Expected Constituent type to be equal to the column "
                       );
        pcVar19 = "type Result Type matrix";
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&local_208,"Expected total number of Constituents to be equal ");
        pcVar19 = "to the number of columns of Result Type matrix";
      }
      break;
    case OpTypeImage:
    case OpTypeSampler:
    case OpTypeSampledImage:
    case OpTypeRuntimeArray:
switchD_001acda4_caseD_19:
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Expected Result Type to be a composite type";
      break;
    case OpTypeArray:
      pIVar15 = ValidationState_t::FindDef(_,uVar9);
      if (pIVar15 == (Instruction *)0x0) {
        __assert_fail("array_inst",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                      ,0x11a,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                     );
      }
      if ((pIVar15->inst_).opcode != 0x1c) {
        __assert_fail("array_inst->opcode() == spv::Op::OpTypeArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                      ,0x11b,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                     );
      }
      pIVar16 = ValidationState_t::FindDef
                          (_,(pIVar15->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[3]);
      iVar6 = spvOpcodeIsSpecConstant((uint)(pIVar16->inst_).opcode);
      if (iVar6 == 0) {
        _member_type = (pointer)0x0;
        bVar5 = ValidationState_t::EvalConstantValUint64
                          (_,(pIVar15->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[3],(uint64_t *)&member_type);
        if (!bVar5) {
          __assert_fail("0 && \"Array type definition is corrupt\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,0x125,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        if (_member_type + 2 == (pointer)(uVar20 & 0xffffffff)) {
          uVar9 = (pIVar15->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[2];
          operand_index_00 = (pointer)0x2;
          do {
            if ((pointer)(uVar20 & 0xffffffff) <= operand_index_00) goto LAB_001ad89d;
            uVar11 = ValidationState_t::GetOperandTypeId(_,inst,(size_t)operand_index_00);
            operand_index_00 = operand_index_00 + 1;
          } while (uVar11 == uVar9);
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::operator<<((ostream *)&local_208,
                          "Expected Constituent type to be equal to the column ");
          pcVar19 = "type Result Type array";
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::operator<<((ostream *)&local_208,"Expected total number of Constituents to be equal "
                         );
          pcVar19 = "to the number of elements of Result Type array";
        }
      }
      else {
LAB_001ad89d:
        bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
        if (!bVar5) {
          return SPV_SUCCESS;
        }
        bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
        if (!bVar5) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = "Cannot create a composite containing 8- or 16-bit types";
      }
      break;
    case OpTypeStruct:
      pIVar15 = ValidationState_t::FindDef(_,uVar9);
      if (pIVar15 == (Instruction *)0x0) {
        __assert_fail("struct_inst",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                      ,0x13d,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                     );
      }
      if ((pIVar15->inst_).opcode != 0x1e) {
        __assert_fail("struct_inst->opcode() == spv::Op::OpTypeStruct",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                      ,0x13e,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                     );
      }
      uVar18 = ((long)(pIVar15->operands_).
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pIVar15->operands_).
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) + 1;
      if (uVar18 == (uVar20 & 0xffffffff)) {
        uVar20 = 2;
        do {
          if (uVar18 <= uVar20) goto LAB_001ad89d;
          uVar9 = ValidationState_t::GetOperandTypeId(_,inst,uVar20);
          puVar1 = (pIVar15->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar20;
          uVar20 = uVar20 + 1;
        } while (uVar9 == *puVar1);
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&local_208,"Expected Constituent type to be equal to the ");
        pcVar19 = "corresponding member type of Result Type struct";
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&local_208,"Expected total number of Constituents to be equal ");
        pcVar19 = "to the number of members of Result Type struct";
      }
      break;
    default:
      if (OVar13 == OpTypeCooperativeMatrixKHR) {
        pIVar15 = ValidationState_t::FindDef(_,uVar9);
        if (pIVar15 == (Instruction *)0x0) {
          __assert_fail("result_type_inst",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,0x155,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        uVar12 = Instruction::GetOperandAs<unsigned_int>(pIVar15,1);
        if (uVar7 == 3) {
LAB_001ad697:
          uVar9 = ValidationState_t::GetOperandTypeId(_,inst,2);
          if (uVar9 == uVar12) goto LAB_001ad89d;
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar19 = "Expected Constituent type to be equal to the component type";
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar19 = "Must be only one constituent";
        }
      }
      else {
        if (OVar13 != OpTypeCooperativeMatrixNV) goto switchD_001acda4_caseD_19;
        pIVar15 = ValidationState_t::FindDef(_,uVar9);
        if (pIVar15 == (Instruction *)0x0) {
          __assert_fail("result_type_inst",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,0x168,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        uVar12 = Instruction::GetOperandAs<unsigned_int>(pIVar15,1);
        if (uVar7 == 3) goto LAB_001ad697;
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = "Expected single constituent";
      }
    }
    break;
  case 0x51:
    _member_type = (pointer)((ulong)uStack_234 << 0x20);
    sVar10 = anon_unknown_1::GetExtractInsertValueType(_,inst,&member_type);
    if (sVar10 != SPV_SUCCESS) {
      return sVar10;
    }
    uVar9 = (inst->inst_).type_id;
    uVar11 = member_type;
    if (uVar9 == member_type) {
      bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
      if (!bVar5) {
        return SPV_SUCCESS;
      }
      bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
      if (!bVar5) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Cannot extract from a composite of 8- or 16-bit types";
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)&local_208,"Result type (Op");
      OVar13 = ValidationState_t::GetIdOpcode(_,uVar9);
      pcVar19 = spvOpcodeString(OVar13);
      std::operator<<((ostream *)&local_208,pcVar19);
      pcVar19 = ") does not match the type that results from indexing into the composite (Op";
LAB_001ad76f:
      std::operator<<((ostream *)&local_208,pcVar19);
      OVar13 = ValidationState_t::GetIdOpcode(_,uVar11);
      pcVar19 = spvOpcodeString(OVar13);
      std::operator<<((ostream *)&local_208,pcVar19);
      pcVar19 = ").";
    }
    break;
  case 0x52:
    uVar9 = ValidationState_t::GetOperandTypeId(_,inst,2);
    uVar11 = ValidationState_t::GetOperandTypeId(_,inst,3);
    if ((inst->inst_).type_id == uVar11) {
      _member_type = _member_type & 0xffffffff00000000;
      sVar10 = anon_unknown_1::GetExtractInsertValueType(_,inst,&member_type);
      if (sVar10 != SPV_SUCCESS) {
        return sVar10;
      }
      uVar11 = member_type;
      if (uVar9 != member_type) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&local_208,"The Object type (Op");
        OVar13 = ValidationState_t::GetIdOpcode(_,uVar9);
        pcVar19 = spvOpcodeString(OVar13);
        std::operator<<((ostream *)&local_208,pcVar19);
        pcVar19 = ") does not match the type that results from indexing into the Composite (Op";
        goto LAB_001ad76f;
      }
      bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
      if (!bVar5) {
        return SPV_SUCCESS;
      }
      bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
      if (!bVar5) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Cannot insert into a composite of 8- or 16-bit types";
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)&local_208,
                      "The Result Type must be the same as Composite type in Op");
      pcVar19 = spvOpcodeString((uint)(inst->inst_).opcode);
      std::operator<<((ostream *)&local_208,pcVar19);
      std::operator<<((ostream *)&local_208," yielding Result Id ");
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      pcVar19 = ".";
    }
    break;
  case 0x53:
    uVar9 = (inst->inst_).type_id;
    uVar11 = ValidationState_t::GetOperandTypeId(_,inst,2);
    if (uVar11 == uVar9) {
      bVar5 = ValidationState_t::IsVoidType(_,uVar9);
      if (!bVar5) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "OpCopyObject cannot have void result type";
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Expected Result Type and Operand type to be the same";
    }
    break;
  case 0x54:
    _member_type = (pointer)((ulong)uStack_234 << 0x20);
    result_num_cols = 0;
    result_col_type = 0;
    result_component_type = 0;
    bVar5 = ValidationState_t::GetMatrixTypeInfo
                      (_,(inst->inst_).type_id,&member_type,&result_num_cols,&result_col_type,
                       &result_component_type);
    if (bVar5) {
      uVar9 = ValidationState_t::GetOperandTypeId(_,inst,2);
      matrix_num_rows = 0;
      matrix_num_cols = 0;
      matrix_col_type = 0;
      matrix_component_type = 0;
      bVar5 = ValidationState_t::GetMatrixTypeInfo
                        (_,uVar9,&matrix_num_rows,&matrix_num_cols,&matrix_col_type,
                         &matrix_component_type);
      if (bVar5) {
        if (result_component_type == matrix_component_type) {
          if ((member_type == matrix_num_cols) && (result_num_cols == matrix_num_rows)) {
            bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
            if (!bVar5) {
              return SPV_SUCCESS;
            }
            bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
            if (!bVar5) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar19 = "Cannot transpose matrices of 16-bit floats";
          }
          else {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            std::operator<<((ostream *)&local_208,
                            "Expected number of columns and the column size of Matrix ");
            pcVar19 = "to be the reverse of those of Result Type";
          }
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::operator<<((ostream *)&local_208,
                          "Expected component types of Matrix and Result Type to be ");
          pcVar19 = "identical";
        }
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = "Expected Matrix to be of type OpTypeMatrix";
      }
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Expected Result Type to be a matrix type";
    }
    break;
  default:
    if (uVar2 != 400) {
      return SPV_SUCCESS;
    }
    pIVar15 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar16 = ValidationState_t::FindDef(_,uVar7);
    pIVar16 = ValidationState_t::FindDef(_,(pIVar16->inst_).type_id);
    if (((pIVar16 == pIVar15) || (pIVar15 == (Instruction *)0x0)) || (pIVar16 == (Instruction *)0x0)
       ) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = "Result Type must not equal the Operand type";
    }
    else {
      bVar5 = ValidationState_t::LogicallyMatch(_,pIVar16,pIVar15,false);
      if (bVar5) {
        bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
        if (!bVar5) {
          return SPV_SUCCESS;
        }
        bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
        if (!bVar5) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = "Cannot copy composites of 8- or 16-bit types";
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar19 = "Result Type does not logically match the Operand type";
      }
    }
  }
LAB_001ad9dc:
  std::operator<<((ostream *)&local_208,pcVar19);
LAB_001ad9ee:
  DiagnosticStream::~DiagnosticStream(&local_208);
  return local_208.error_;
}

Assistant:

spv_result_t CompositesPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpVectorExtractDynamic:
      return ValidateVectorExtractDynamic(_, inst);
    case spv::Op::OpVectorInsertDynamic:
      return ValidateVectorInsertDyanmic(_, inst);
    case spv::Op::OpVectorShuffle:
      return ValidateVectorShuffle(_, inst);
    case spv::Op::OpCompositeConstruct:
      return ValidateCompositeConstruct(_, inst);
    case spv::Op::OpCompositeExtract:
      return ValidateCompositeExtract(_, inst);
    case spv::Op::OpCompositeInsert:
      return ValidateCompositeInsert(_, inst);
    case spv::Op::OpCopyObject:
      return ValidateCopyObject(_, inst);
    case spv::Op::OpTranspose:
      return ValidateTranspose(_, inst);
    case spv::Op::OpCopyLogical:
      return ValidateCopyLogical(_, inst);
    default:
      break;
  }

  return SPV_SUCCESS;
}